

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

float rsg::UnaryTrigonometricFunc<rsg::AtanOp>::getCompWeight(float outMin,float outMax)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float inMax;
  float inMin;
  float local_10;
  float local_c;
  
  fVar2 = 1.0;
  if ((((-INFINITY < outMin) && (outMax < INFINITY)) && (fVar2 = 0.0, outMin <= 1.0)) &&
     (-1.0 <= outMax)) {
    fVar2 = outMin;
    if (outMin <= -1.0) {
      fVar2 = -1.0;
    }
    local_c = tanf(fVar2);
    fVar2 = outMax;
    if (1.0 <= outMax) {
      fVar2 = 1.0;
    }
    local_10 = tanf(fVar2);
    bVar1 = quantizeFloatRange(&local_c,&local_10);
    fVar2 = 0.0;
    if (bVar1) {
      if ((outMin != outMax) || (NAN(outMin) || NAN(outMax))) {
        fVar2 = atanf(local_10);
        fVar3 = atanf(local_c);
        fVar3 = (fVar2 - fVar3) / (outMax - outMin);
        fVar2 = 0.1;
        if (0.1 <= fVar3) {
          fVar2 = fVar3;
        }
      }
      else {
        fVar2 = 1.0;
      }
    }
  }
  return fVar2;
}

Assistant:

static inline float getCompWeight (float outMin, float outMax)
	{
		if (Scalar::min<float>() == outMin || Scalar::max<float>() == outMax)
			return 1.0f; // Infinite value range, anything goes

		// Transform range
		float inMin, inMax;
		if (!C::transformValueRange(outMin, outMax, inMin, inMax))
			return 0.0f; // Not possible to transform value range (out of range perhaps)

		// Quantize
		if (!quantizeFloatRange(inMin, inMax))
			return 0.0f; // Not possible to quantize - would cause accuracy issues

		if (outMin == outMax)
			return 1.0f; // Constant value and passed quantization

		// Evaluate new intersection
		float intersectionLen	= C::evaluateComp(inMax) - C::evaluateComp(inMin);
		float valRangeLen		= outMax - outMin;

		return deFloatMax(0.1f, intersectionLen/valRangeLen);
	}